

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,string *name,
          shared_ptr<helics::Core> *obj,CoreType type)

{
  initializer_list<helics::CoreType> __l;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_bool>
  pVar1;
  allocator_type local_45;
  CoreType local_44;
  _Vector_base<helics::CoreType,_std::allocator<helics::CoreType>_> local_40;
  
  std::mutex::lock(&this->mapLock);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<helics::Core>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>>
                      *)&this->objectMap,name,obj);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    __l._M_len = 1;
    __l._M_array = &local_44;
    local_44 = type;
    std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>::vector
              ((vector<helics::CoreType,_std::allocator<helics::CoreType>_> *)&local_40,__l,
               &local_45);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
                *)&this->typeMap,name,
               (vector<helics::CoreType,_std::allocator<helics::CoreType>_> *)&local_40);
    std::_Vector_base<helics::CoreType,_std::allocator<helics::CoreType>_>::~_Vector_base(&local_40)
    ;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return (bool)(pVar1.second & 1);
}

Assistant:

bool addObject(const std::string& name, std::shared_ptr<X> obj, Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto res = objectMap.emplace(name, std::move(obj));
        if (res.second) {
            typeMap.emplace(name, std::vector<Y>{type});
        }
        return res.second;
    }